

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Kind v)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "model";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "group";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "assembly";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "component";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "subcomponent";
    paVar1 = &local_d;
    break;
  case 5:
    pcVar2 = "sceneLibrary";
    paVar1 = &local_e;
    break;
  case 6:
    pcVar2 = "[[InternalError. UserDefKind]]";
    paVar1 = &local_f;
    break;
  default:
    pcVar2 = "[[InvalidKind]]";
    paVar1 = &local_10;
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Kind v) {
  if (v == tinyusdz::Kind::Model) {
    return "model";
  } else if (v == tinyusdz::Kind::Group) {
    return "group";
  } else if (v == tinyusdz::Kind::Assembly) {
    return "assembly";
  } else if (v == tinyusdz::Kind::Component) {
    return "component";
  } else if (v == tinyusdz::Kind::Subcomponent) {
    return "subcomponent";
  } else if (v == tinyusdz::Kind::SceneLibrary) {
    return "sceneLibrary";
  } else if (v == tinyusdz::Kind::UserDef) {
    // Should use PrimMeta::get_kind() to get actual Kind string value.
    return "[[InternalError. UserDefKind]]";
  } else {
    return "[[InvalidKind]]";
  }
}